

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StaticAssertTask::~StaticAssertTask(StaticAssertTask *this)

{
  StaticAssertTask *this_local;
  
  ~StaticAssertTask(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

StaticAssertTask() : SystemSubroutine("$static_assert", SubroutineKind::Task) {}